

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDrawTestCaseUtil.hpp
# Opt level: O0

TestInstance * __thiscall
vkt::Draw::InstanceFactory<vkt::Draw::(anonymous_namespace)::DrawIndexed>::createInstance
          (InstanceFactory<vkt::Draw::(anonymous_namespace)::DrawIndexed> *this,Context *context)

{
  Context *context_00;
  DrawIndexed *this_00;
  TestSpecBase local_50;
  Context *local_18;
  Context *context_local;
  InstanceFactory<vkt::Draw::(anonymous_namespace)::DrawIndexed> *this_local;
  
  local_18 = context;
  context_local = (Context *)this;
  this_00 = (DrawIndexed *)operator_new(0x1e0);
  context_00 = local_18;
  TestSpecBase::TestSpecBase(&local_50,&this->m_testSpec);
  anon_unknown_10::DrawIndexed::DrawIndexed(this_00,context_00,&local_50);
  TestSpecBase::~TestSpecBase(&local_50);
  return (TestInstance *)this_00;
}

Assistant:

TestInstance* createInstance (Context& context) const
	{
		return new Instance(context, m_testSpec);
	}